

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmConstructionPlane::Read(ON_3dmConstructionPlane *this,ON_BinaryArchive *file)

{
  bool bVar1;
  long lVar2;
  ON_Plane *pOVar3;
  ON_3dmConstructionPlane *pOVar4;
  byte bVar5;
  int minor_version;
  int major_version;
  int local_20;
  int local_1c;
  
  bVar5 = 0;
  ON_wString::Destroy(&this->m_name);
  pOVar3 = &ON_xy_plane;
  pOVar4 = this;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar4->m_plane).origin.x = (pOVar3->origin).x;
    pOVar3 = (ON_Plane *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_3dmConstructionPlane *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  this->m_grid_spacing = 1.0;
  this->m_snap_spacing = 1.0;
  this->m_grid_line_count = 0x46;
  this->m_grid_thick_frequency = 5;
  this->m_bDepthBuffer = true;
  local_1c = 0;
  local_20 = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_1c,&local_20);
  if ((bVar1) && (local_1c == 1)) {
    bVar1 = ON_BinaryArchive::ReadPlane(file,&this->m_plane);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_spacing);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_snap_spacing);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_grid_line_count);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_grid_thick_frequency);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadString(file,&this->m_name);
    }
    if ((bVar1 != false) && (0 < local_20)) {
      bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bDepthBuffer);
    }
  }
  return bVar1;
}

Assistant:

bool ON_3dmConstructionPlane::Read( ON_BinaryArchive& file )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    if (rc) rc = file.ReadPlane(m_plane);
    if (rc) rc = file.ReadDouble(&m_grid_spacing);
    if (rc) rc = file.ReadDouble(&m_snap_spacing);
    if (rc) rc = file.ReadInt(&m_grid_line_count);
    if (rc) rc = file.ReadInt(&m_grid_thick_frequency);
    if (rc) rc = file.ReadString(m_name);

    if ( minor_version >= 1 )
    {
      if (rc) rc = file.ReadBool(&m_bDepthBuffer);
    }
  }
  return rc;
}